

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O2

ScenarioLowerBound * __thiscall
despot::BaseTag::CreateScenarioLowerBound(BaseTag *this,string *name,string *particle_bound_name)

{
  BeliefMDP *model;
  StatePolicy *pSVar1;
  OBS_TYPE OVar2;
  bool bVar3;
  int iVar4;
  TrivialParticleLowerBound *this_00;
  TagHistoryModePolicy *this_01;
  ParticleLowerBound *pPVar5;
  ostream *poVar6;
  StateIndexer *pSVar7;
  string *this_02;
  allocator<char> local_219;
  StateIndexer *local_218;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  string local_f0 [32];
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  model = &this->super_BeliefMDP;
  bVar3 = std::operator==(name,"TRIVIAL");
  if (bVar3) {
    this_00 = (TrivialParticleLowerBound *)operator_new(0x10);
    despot::TrivialParticleLowerBound::TrivialParticleLowerBound(this_00,(DSPOMDP *)model);
    return (ScenarioLowerBound *)this_00;
  }
  bVar3 = std::operator==(name,"RANDOM");
  if (bVar3) {
    this_01 = (TagHistoryModePolicy *)operator_new(0x38);
    std::__cxx11::string::string(local_50,(string *)particle_bound_name);
    this_02 = local_50;
    pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,this_02);
    despot::RandomPolicy::RandomPolicy((RandomPolicy *)this_01,(DSPOMDP *)model,pPVar5);
  }
  else {
    bVar3 = std::operator==(name,"SHR");
    if ((bVar3) ||
       ((bVar3 = std::operator==(name,"DEFAULT"), bVar3 &&
        (OVar2 = this->same_loc_obs_, iVar4 = despot::Floor::NumCells(), OVar2 != (long)iVar4)))) {
      this_01 = (TagHistoryModePolicy *)operator_new(0x68);
      std::__cxx11::string::string(local_70,(string *)particle_bound_name);
      this_02 = local_70;
      pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,this_02);
      TagSHRPolicy::TagSHRPolicy((TagSHRPolicy *)this_01,(DSPOMDP *)model,pPVar5);
    }
    else {
      bVar3 = std::operator==(name,"HM");
      if (bVar3) {
        this_01 = (TagHistoryModePolicy *)operator_new(0xa8);
        std::__cxx11::string::string(local_90,(string *)particle_bound_name);
        this_02 = local_90;
        pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,this_02);
        TagHistoryModePolicy::TagHistoryModePolicy(this_01,(DSPOMDP *)model,pPVar5);
      }
      else {
        pSVar1 = &this->super_StatePolicy;
        bVar3 = std::operator==(name,"MMAP-MDP");
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_170,"MDP",&local_219);
          ComputeDefaultActions(this,&local_170);
          std::__cxx11::string::~string((string *)&local_170);
          this_01 = (TagHistoryModePolicy *)operator_new(0x30);
          std::__cxx11::string::string(local_b0,(string *)particle_bound_name);
          this_02 = local_b0;
          pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,this_02);
          despot::MMAPStatePolicy::MMAPStatePolicy
                    ((MMAPStatePolicy *)this_01,(DSPOMDP *)model,&this->super_MMAPInferencer,pSVar1,
                     pPVar5);
        }
        else {
          bVar3 = std::operator==(name,"MMAP-SP");
          if (bVar3) {
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_190,"SP",&local_219)
            ;
            ComputeDefaultActions(this,&local_190);
            std::__cxx11::string::~string((string *)&local_190);
            this_01 = (TagHistoryModePolicy *)operator_new(0x30);
            std::__cxx11::string::string(local_d0,(string *)particle_bound_name);
            this_02 = local_d0;
            pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,this_02);
            despot::MMAPStatePolicy::MMAPStatePolicy
                      ((MMAPStatePolicy *)this_01,(DSPOMDP *)model,&this->super_MMAPInferencer,
                       pSVar1,pPVar5);
          }
          else {
            pSVar7 = &this->super_StateIndexer;
            bVar3 = std::operator==(name,"MODE-MDP");
            if ((bVar3) ||
               ((bVar3 = std::operator==(name,"DEFAULT"), bVar3 &&
                (OVar2 = this->same_loc_obs_, local_218 = pSVar7, iVar4 = despot::Floor::NumCells(),
                pSVar7 = local_218, OVar2 == (long)iVar4)))) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1b0,"MDP",&local_219);
              ComputeDefaultActions(this,&local_1b0);
              std::__cxx11::string::~string((string *)&local_1b0);
              this_01 = (TagHistoryModePolicy *)operator_new(0x48);
              std::__cxx11::string::string(local_f0,(string *)particle_bound_name);
              this_02 = local_f0;
              pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,this_02);
              despot::ModeStatePolicy::ModeStatePolicy
                        ((ModeStatePolicy *)this_01,(DSPOMDP *)model,pSVar7,pSVar1,pPVar5);
            }
            else {
              bVar3 = std::operator==(name,"MODE-SP");
              if (bVar3) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1d0,"SP",&local_219);
                ComputeDefaultActions(this,&local_1d0);
                std::__cxx11::string::~string((string *)&local_1d0);
                this_01 = (TagHistoryModePolicy *)operator_new(0x48);
                std::__cxx11::string::string(local_110,(string *)particle_bound_name);
                this_02 = local_110;
                pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,this_02);
                despot::ModeStatePolicy::ModeStatePolicy
                          ((ModeStatePolicy *)this_01,(DSPOMDP *)model,pSVar7,pSVar1,pPVar5);
              }
              else {
                bVar3 = std::operator==(name,"MAJORITY-MDP");
                if (bVar3) {
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1f0,"MDP",&local_219);
                  ComputeDefaultActions(this,&local_1f0);
                  std::__cxx11::string::~string((string *)&local_1f0);
                  this_01 = (TagHistoryModePolicy *)operator_new(0x28);
                  std::__cxx11::string::string(local_130,(string *)particle_bound_name);
                  this_02 = local_130;
                  pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,this_02)
                  ;
                  despot::MajorityActionPolicy::MajorityActionPolicy
                            ((MajorityActionPolicy *)this_01,(DSPOMDP *)model,pSVar1,pPVar5);
                }
                else {
                  bVar3 = std::operator==(name,"MAJORITY-SP");
                  if (!bVar3) {
                    bVar3 = std::operator!=(name,"print");
                    if (bVar3) {
                      poVar6 = std::operator<<((ostream *)&std::cerr,"Unsupported lower bound: ");
                      poVar6 = std::operator<<(poVar6,(string *)name);
                      std::endl<char,std::char_traits<char>>(poVar6);
                    }
                    poVar6 = std::operator<<((ostream *)&std::cerr,
                                             "Supported types: TRIVIAL, RANDOM, SHR, MODE-MDP, MODE-SP, MAJORITY-MDP, MAJORITY-SP (default to MODE-MDP)"
                                            );
                    std::endl<char,std::char_traits<char>>(poVar6);
                    poVar6 = std::operator<<((ostream *)&std::cerr,
                                             "With base lower bound: except TRIVIAL");
                    std::endl<char,std::char_traits<char>>(poVar6);
                    exit(1);
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_210,"SP",&local_219);
                  ComputeDefaultActions(this,&local_210);
                  std::__cxx11::string::~string((string *)&local_210);
                  this_01 = (TagHistoryModePolicy *)operator_new(0x28);
                  std::__cxx11::string::string(local_150,(string *)particle_bound_name);
                  this_02 = local_150;
                  pPVar5 = (ParticleLowerBound *)(**(code **)(*(long *)model + 0x70))(model,this_02)
                  ;
                  despot::MajorityActionPolicy::MajorityActionPolicy
                            ((MajorityActionPolicy *)this_01,(DSPOMDP *)model,pSVar1,pPVar5);
                }
              }
            }
          }
        }
      }
    }
  }
  std::__cxx11::string::~string(this_02);
  return (ScenarioLowerBound *)this_01;
}

Assistant:

ScenarioLowerBound* BaseTag::CreateScenarioLowerBound(string name, string
	particle_bound_name) const {
	const DSPOMDP* model = this;
	const StateIndexer* indexer = this;
	const StatePolicy* policy = this;
	const MMAPInferencer* mmap_inferencer = this;
	if (name == "TRIVIAL") {
		return new TrivialParticleLowerBound(model);
	} else if (name == "RANDOM") {
		return new RandomPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "SHR"
		|| (name == "DEFAULT" && same_loc_obs_ != floor_.NumCells())) {
		return new TagSHRPolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "HM") {
		return new TagHistoryModePolicy(model,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MMAP-MDP") {
		ComputeDefaultActions("MDP");
		return new MMAPStatePolicy(model, *mmap_inferencer,
			*policy, CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MMAP-SP") {
		ComputeDefaultActions("SP");
		return new MMAPStatePolicy(model, *mmap_inferencer,
			*policy, CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE-MDP"
		|| (name == "DEFAULT" && same_loc_obs_ == floor_.NumCells())) {
		ComputeDefaultActions("MDP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MODE-SP") {
		ComputeDefaultActions("SP");
		return new ModeStatePolicy(model, *indexer, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY-MDP") {
		ComputeDefaultActions("MDP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else if (name == "MAJORITY-SP") {
		ComputeDefaultActions("SP");
		return new MajorityActionPolicy(model, *policy,
			CreateParticleLowerBound(particle_bound_name));
	} else {
		if (name != "print")
			cerr << "Unsupported lower bound: " << name << endl;
		cerr << "Supported types: TRIVIAL, RANDOM, SHR, MODE-MDP, MODE-SP, MAJORITY-MDP, MAJORITY-SP (default to MODE-MDP)" << endl;
		cerr << "With base lower bound: except TRIVIAL" << endl;
		exit(1);
		return NULL;
	}
}